

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O3

int __thiscall
QAbstractItemViewPrivate::delegateRefCount
          (QAbstractItemViewPrivate *this,QAbstractItemDelegate *delegate)

{
  Data *pDVar1;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar2;
  bool bVar3;
  bool bVar4;
  QObject *pQVar5;
  _Rb_tree_node_base *p_Var6;
  uint uVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  uint uVar10;
  
  pDVar1 = (this->itemDelegate).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar5 = (QObject *)0x0;
  }
  else {
    pQVar5 = (this->itemDelegate).wp.value;
  }
  uVar10 = (uint)(pQVar5 == &delegate->super_QObject);
  bVar4 = true;
  do {
    pQVar2 = (&this->rowDelegates)[(byte)~bVar4 & 1].d.d.ptr;
    if (pQVar2 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                   *)0x0) {
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var6 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl + 0x18);
    }
    p_Var9 = (_Rb_tree_node_base *)((long)&(pQVar2->m)._M_t._M_impl + 8);
    if (pQVar2 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                   *)0x0) {
      p_Var9 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var6 != p_Var9; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if ((p_Var6[1]._M_parent == (_Base_ptr)0x0) ||
         (*(int *)&(p_Var6[1]._M_parent)->field_0x4 == 0)) {
        p_Var8 = (_Base_ptr)0x0;
      }
      else {
        p_Var8 = p_Var6[1]._M_left;
      }
      if ((p_Var8 == (_Base_ptr)delegate) &&
         (uVar7 = uVar10 + 1, bVar3 = 0 < (int)uVar10, uVar10 = uVar7, bVar3)) {
        return uVar7;
      }
    }
    bVar3 = !bVar4;
    bVar4 = false;
    if (bVar3) {
      return uVar10;
    }
  } while( true );
}

Assistant:

int delegateRefCount(const QAbstractItemDelegate *delegate) const
    {
        int ref = 0;
        if (itemDelegate == delegate)
            ++ref;

        for (int maps = 0; maps < 2; ++maps) {
            const QMap<int, QPointer<QAbstractItemDelegate> > *delegates = maps ? &columnDelegates : &rowDelegates;
            for (QMap<int, QPointer<QAbstractItemDelegate> >::const_iterator it = delegates->begin();
                it != delegates->end(); ++it) {
                    if (it.value() == delegate) {
                        ++ref;
                        // optimization, we are only interested in the ref count values 0, 1 or >=2
                        if (ref >= 2) {
                            return ref;
                        }
                    }
            }
        }
        return ref;
    }